

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O1

void tty_setbaudrate(void)

{
  bool bVar1;
  speed_t __speed;
  termios options;
  termios local_4c;
  
  if (TTY_Fd < 0) {
    return;
  }
  switch((uint)*DLTTYOut >> 4 & 0xf) {
  case 0:
    __speed = 1;
    break;
  case 1:
    __speed = 2;
    break;
  case 2:
    __speed = 3;
    break;
  case 3:
    __speed = 4;
    break;
  case 4:
    __speed = 5;
    break;
  case 5:
    __speed = 7;
    break;
  case 6:
    __speed = 8;
    break;
  case 7:
    __speed = 9;
    break;
  case 8:
    __speed = 10;
    break;
  default:
    __speed = 0xffffffff;
    bVar1 = true;
    goto LAB_0013559b;
  case 10:
    __speed = 0xb;
    break;
  case 0xc:
    __speed = 0xc;
    break;
  case 0xe:
    __speed = 0xd;
  }
  bVar1 = false;
LAB_0013559b:
  if (!bVar1) {
    tcgetattr(TTY_Fd,&local_4c);
    cfsetispeed(&local_4c,__speed);
    cfsetospeed(&local_4c,__speed);
    tcsetattr(TTY_Fd,0,&local_4c);
    return;
  }
  error("TTY: tty_setbaudrate");
  return;
}

Assistant:

void tty_setbaudrate(void)
{
  speed_t baudrate;

  if (TTY_Fd >= 0) {
    if ((baudrate = tty_baudtosymbol(DLTTYOut->line_speed)) != -1) {
        struct termios options;
        tcgetattr(TTY_Fd, &options);
        cfsetispeed(&options, baudrate);
        cfsetospeed(&options, baudrate);
        tcsetattr(TTY_Fd, TCSANOW, &options);
    } else {
      error("TTY: tty_setbaudrate");
    }
  }
}